

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_write_buffer.c"
            );
  UnityDefaultTestRun(test_cio_write_buffer_element_init,"test_cio_write_buffer_element_init",0x1a1)
  ;
  UnityDefaultTestRun(test_cio_write_buffer_const_element_init,
                      "test_cio_write_buffer_const_element_init",0x1a2);
  UnityDefaultTestRun(test_cio_write_buffer_head_init,"test_cio_write_buffer_head_init",0x1a3);
  UnityDefaultTestRun(test_cio_write_buffer_queue_tail,"test_cio_write_buffer_queue_tail",0x1a4);
  UnityDefaultTestRun(test_cio_write_buffer_queue_head,"test_cio_write_buffer_queue_head",0x1a5);
  UnityDefaultTestRun(test_cio_write_buffer_peek_and_last,"test_cio_write_buffer_peek_and_last",
                      0x1a6);
  UnityDefaultTestRun(test_cio_write_buffer_peek_from_empty_queue,
                      "test_cio_write_buffer_peek_from_empty_queue",0x1a7);
  UnityDefaultTestRun(test_cio_write_buffer_last_from_empty_queue,
                      "test_cio_write_buffer_last_from_empty_queue",0x1a8);
  UnityDefaultTestRun(test_cio_write_buffer_splice,"test_cio_write_buffer_splice",0x1a9);
  UnityDefaultTestRun(test_cio_write_buffer_splice_empty_list,
                      "test_cio_write_buffer_splice_empty_list",0x1aa);
  UnityDefaultTestRun(test_cio_write_buffer_split_and_append,
                      "test_cio_write_buffer_split_and_append",0x1ab);
  UnityDefaultTestRun(test_cio_write_buffer_split_and_append_empty_list,
                      "test_cio_write_buffer_split_and_append_empty_list",0x1ac);
  UnityDefaultTestRun(test_cio_write_buffer_split_and_append_head,
                      "test_cio_write_buffer_split_and_append_head",0x1ad);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_cio_write_buffer_element_init);
	RUN_TEST(test_cio_write_buffer_const_element_init);
	RUN_TEST(test_cio_write_buffer_head_init);
	RUN_TEST(test_cio_write_buffer_queue_tail);
	RUN_TEST(test_cio_write_buffer_queue_head);
	RUN_TEST(test_cio_write_buffer_peek_and_last);
	RUN_TEST(test_cio_write_buffer_peek_from_empty_queue);
	RUN_TEST(test_cio_write_buffer_last_from_empty_queue);
	RUN_TEST(test_cio_write_buffer_splice);
	RUN_TEST(test_cio_write_buffer_splice_empty_list);
	RUN_TEST(test_cio_write_buffer_split_and_append);
	RUN_TEST(test_cio_write_buffer_split_and_append_empty_list);
	RUN_TEST(test_cio_write_buffer_split_and_append_head);
	return UNITY_END();
}